

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O2

void __thiscall Arithmetic_MultipleLocals_Test::TestBody(Arithmetic_MultipleLocals_Test *this)

{
  ulong uVar1;
  AssertionResult *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  undefined1 local_180 [8];
  MockCompiler mock;
  BcIns arr [2];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar_;
  
  mock.cur_ins = 0x101010500000005;
  MockCompiler::MockCompiler((MockCompiler *)local_180,(BcIns *)&mock.cur_ins,2);
  this_00 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  bVar3 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
  local_30.ptr_._0_1_ = bVar3;
  if (bVar3) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
    local_30.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar1 & 0xffff)
    ;
    gtest_ar_.message_.ptr_._0_4_ = 0;
    mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
    testing::internal::CmpHelperEQ<unsigned_long,IrOp>
              ((internal *)local_50,"ir_op(ins)","IR_LOAD_STACK",(unsigned_long *)&local_30,
               (IrOp *)&gtest_ar_.message_);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                 ,0xb2,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
      local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"ir_arg1(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                 (int *)&local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                   ,0xb2,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x20);
        local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_50,"ir_arg2(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                   (int *)&local_30);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_30);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                     ,0xb2,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          bVar3 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
          local_30.ptr_._0_1_ = bVar3;
          if (!bVar3) {
            testing::Message::Message((Message *)&gtest_ar_.message_);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_50,(internal *)&local_30,
                       (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)arr,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                       ,0xb3,(char *)CONCAT71(local_50._1_7_,local_50[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
            goto LAB_0010b0f2;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
          uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
          local_30.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (uVar1 & 0xffff);
          gtest_ar_.message_.ptr_._0_4_ = 1;
          mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
          testing::internal::CmpHelperEQ<unsigned_long,IrOp>
                    ((internal *)local_50,"ir_op(ins)","IR_LOAD_CONST",(unsigned_long *)&local_30,
                     (IrOp *)&gtest_ar_.message_);
          if (local_50[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                       ,0xb3,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
            local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<unsigned_short,int>
                      ((internal *)local_50,"ir_arg1(ins)","0",(unsigned_short *)&gtest_ar_.message_
                       ,(int *)&local_30);
            if (local_50[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_30);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                         ,0xb3,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar);
              gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x20);
              local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<unsigned_short,int>
                        ((internal *)local_50,"ir_arg2(ins)","0",
                         (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
              if (local_50[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_30);
                if (gtest_ar._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                           ,0xb3,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar);
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                bVar3 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                local_30.ptr_._0_1_ = bVar3;
                if (!bVar3) {
                  testing::Message::Message((Message *)&gtest_ar_.message_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_50,(internal *)&local_30,
                             (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true"
                             ,in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)arr,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                             ,0xb4,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
                  goto LAB_0010b0f2;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)this_00);
                uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
                local_30.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar1 & 0xffff);
                gtest_ar_.message_.ptr_._0_4_ = 0x100;
                mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
                testing::internal::CmpHelperEQ<unsigned_long,IrOp>
                          ((internal *)local_50,"ir_op(ins)","IR_ADD",(unsigned_long *)&local_30,
                           (IrOp *)&gtest_ar_.message_);
                if (local_50[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_30);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                             ,0xb4,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar);
                  gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                  local_30.ptr_._0_4_ = 1;
                  testing::internal::CmpHelperEQ<unsigned_short,int>
                            ((internal *)local_50,"ir_arg1(ins)","1",
                             (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                  if (local_50[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_30);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                               ,0xb4,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar);
                    gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x20);
                    local_30.ptr_._0_4_ = 2;
                    testing::internal::CmpHelperEQ<unsigned_short,int>
                              ((internal *)local_50,"ir_arg2(ins)","2",
                               (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                    if (local_50[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_30);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                 ,0xb4,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar);
                      gtest_ar_.success_ = false;
                      gtest_ar_._1_7_ = 0;
                      bVar3 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                      local_30.ptr_._0_1_ = bVar3;
                      if (!bVar3) {
                        testing::Message::Message((Message *)&gtest_ar_.message_);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_50,(internal *)&local_30,
                                   (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)arr,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                   ,0xb5,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
                        goto LAB_0010b0f2;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)this_00);
                      uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
                      local_30.ptr_ =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)(uVar1 & 0xffff);
                      gtest_ar_.message_.ptr_._0_4_ = 0;
                      mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
                      testing::internal::CmpHelperEQ<unsigned_long,IrOp>
                                ((internal *)local_50,"ir_op(ins)","IR_LOAD_STACK",
                                 (unsigned_long *)&local_30,(IrOp *)&gtest_ar_.message_);
                      if (local_50[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_30);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                   ,0xb5,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&gtest_ar);
                        gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                        local_30.ptr_._0_4_ = 1;
                        testing::internal::CmpHelperEQ<unsigned_short,int>
                                  ((internal *)local_50,"ir_arg1(ins)","1",
                                   (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                        if (local_50[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_30);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                     ,0xb5,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&gtest_ar);
                          gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x20);
                          local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<unsigned_short,int>
                                    ((internal *)local_50,"ir_arg2(ins)","0",
                                     (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                          if (local_50[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_30);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                       ,0xb5,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                          }
                          else {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&gtest_ar);
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            bVar3 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                            local_30.ptr_._0_1_ = bVar3;
                            if (!bVar3) {
                              testing::Message::Message((Message *)&gtest_ar_.message_);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)local_50,(internal *)&local_30,
                                         (AssertionResult *)"mock.cur_ins < mock.trace->ir_count",
                                         "false","true",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)arr,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                         ,0xb6,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
                              goto LAB_0010b0f2;
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)this_00);
                            uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8
                                              );
                            local_30.ptr_ =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(uVar1 & 0xffff);
                            gtest_ar_.message_.ptr_._0_4_ = 1;
                            mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
                            testing::internal::CmpHelperEQ<unsigned_long,IrOp>
                                      ((internal *)local_50,"ir_op(ins)","IR_LOAD_CONST",
                                       (unsigned_long *)&local_30,(IrOp *)&gtest_ar_.message_);
                            if (local_50[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_30);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                         ,0xb6,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&gtest_ar);
                              gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                              local_30.ptr_._0_4_ = 1;
                              testing::internal::CmpHelperEQ<unsigned_short,int>
                                        ((internal *)local_50,"ir_arg1(ins)","1",
                                         (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                              if (local_50[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_30);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                           ,0xb6,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30)
                                ;
                              }
                              else {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&gtest_ar);
                                gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x20);
                                local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
                                testing::internal::CmpHelperEQ<unsigned_short,int>
                                          ((internal *)local_50,"ir_arg2(ins)","0",
                                           (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                                if (local_50[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_30);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar2 = "";
                                  }
                                  else {
                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                             ,0xb6,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_30);
                                }
                                else {
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&gtest_ar);
                                  gtest_ar_.success_ = false;
                                  gtest_ar_._1_7_ = 0;
                                  bVar3 = mock.trace <
                                          (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                                  local_30.ptr_._0_1_ = bVar3;
                                  if (!bVar3) {
                                    testing::Message::Message((Message *)&gtest_ar_.message_);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)local_50,(internal *)&local_30,
                                               (AssertionResult *)
                                               "mock.cur_ins < mock.trace->ir_count","false","true",
                                               in_R9);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)arr,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                               ,0xb7,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
                                    goto LAB_0010b0f2;
                                  }
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)this_00);
                                  uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) +
                                                    (long)mock.trace * 8);
                                  local_30.ptr_ =
                                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(uVar1 & 0xffff);
                                  gtest_ar_.message_.ptr_._0_4_ = 0x100;
                                  mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
                                  testing::internal::CmpHelperEQ<unsigned_long,IrOp>
                                            ((internal *)local_50,"ir_op(ins)","IR_ADD",
                                             (unsigned_long *)&local_30,(IrOp *)&gtest_ar_.message_)
                                  ;
                                  if (local_50[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_30);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar2 = "";
                                    }
                                    else {
                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                               ,0xb7,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_.message_,
                                               (Message *)&local_30);
                                  }
                                  else {
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                    gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                                    local_30.ptr_._0_4_ = 4;
                                    testing::internal::CmpHelperEQ<unsigned_short,int>
                                              ((internal *)local_50,"ir_arg1(ins)","4",
                                               (unsigned_short *)&gtest_ar_.message_,
                                               (int *)&local_30);
                                    if (local_50[0] != (internal)0x0) {
                                      testing::internal::
                                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                      gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x20);
                                      local_30.ptr_._0_4_ = 5;
                                      testing::internal::CmpHelperEQ<unsigned_short,int>
                                                ((internal *)local_50,"ir_arg2(ins)","5",
                                                 (unsigned_short *)&gtest_ar_.message_,
                                                 (int *)&local_30);
                                      if (local_50[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_30);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar2 = "";
                                        }
                                        else {
                                          pcVar2 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure
                                                   ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                                  ,0xb7,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_.message_,
                                                   (Message *)&local_30);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_.message_);
                                        testing::internal::
                                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~scoped_ptr(&local_30);
                                      }
                                      this_00 = &gtest_ar;
                                      goto LAB_0010b261;
                                    }
                                    testing::Message::Message((Message *)&local_30);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar2 = "";
                                    }
                                    else {
                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                               ,0xb7,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_.message_,
                                               (Message *)&local_30);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    this_00 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)&local_30,
               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)arr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0xb2,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
LAB_0010b0f2:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)arr);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_.message_);
  }
LAB_0010b261:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  MockCompiler::~MockCompiler((MockCompiler *)local_180);
  return;
}

Assistant:

TEST(Arithmetic, MultipleLocals) {
	// let a = 0 let b = 0 while true { a = a + 1 b = b + 2 }
	MOCK(
		BC3(BC_ADD_LN, 0, 0, 0),
		BC3(BC_ADD_LN, 1, 1, 1),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_CONST, 0, 0);
	INS(IR_ADD, 1, 2);
	INS(IR_LOAD_STACK, 1, 0);
	INS(IR_LOAD_CONST, 1, 0);
	INS(IR_ADD, 4, 5);
}